

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int lyp_is_rpc_action(lys_node *node)

{
  lys_node *plVar1;
  
  if (node == (lys_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0xcc,"int lyp_is_rpc_action(struct lys_node *)");
  }
  do {
    plVar1 = lys_parent(node);
    if (plVar1 == (lys_node *)0x0) {
      return (uint)((node->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN);
    }
    node = lys_parent(node);
  } while (node->nodetype != LYS_ACTION);
  return 1;
}

Assistant:

int
lyp_is_rpc_action(struct lys_node *node)
{
    assert(node);

    while (lys_parent(node)) {
        node = lys_parent(node);
        if (node->nodetype == LYS_ACTION) {
            break;
        }
    }

    if (node->nodetype & (LYS_RPC | LYS_ACTION)) {
        return 1;
    } else {
        return 0;
    }
}